

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

uint av1_int_pro_motion_estimation
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int mi_row,int mi_col,MV *ref_mv,
               uint *y_sad_zero,int me_search_size_col,int me_search_size_row)

{
  aom_tune_content aVar1;
  MB_MODE_INFO *pMVar2;
  uint8_t *puVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  YV12_BUFFER_CONFIG *src;
  buf_2d *pbVar15;
  int16_t *ref;
  int16_t *ref_00;
  int16_t *memblk;
  int16_t *src_00;
  int iVar16;
  uint uVar17;
  long lVar18;
  undefined7 in_register_00000011;
  MV MVar19;
  int iVar20;
  ulong uVar21;
  uint8_t *puVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  int best_sad_row;
  int best_sad_col;
  uint this_sad [4];
  buf_2d backup_yv12 [3];
  uint8_t *pos [4];
  int local_110;
  int local_10c;
  uint local_108 [6];
  int16_t *local_f0;
  MV *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  long local_b8 [12];
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  
  pMVar2 = *(x->e_mbd).mi;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  aVar1 = (cpi->oxcf).tune_cfg.content;
  if (aVar1 == AOM_CONTENT_SCREEN) {
    bVar23 = ((cpi->common).seq_params)->sb_size == bsize;
  }
  else {
    bVar23 = false;
  }
  uVar21 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar9 = (cpi->oxcf).border_in_pixels & 0xfffffff0;
  iVar20 = mi_col * 4 - me_search_size_col;
  if ((SBORROW4(iVar20,-uVar9) != (int)(iVar20 + uVar9) < 0) ||
     ((int)((cpi->common).width + uVar9) < mi_col * 4 + me_search_size_col)) {
    me_search_size_col = uVar9;
  }
  iVar20 = mi_row * 4 - me_search_size_row;
  if ((SBORROW4(iVar20,-uVar9) != (int)(iVar20 + uVar9) < 0) ||
     ((int)((cpi->common).height + uVar9) < mi_row * 4 + me_search_size_row)) {
    me_search_size_row = uVar9;
  }
  local_d8 = (ulong)block_size_wide[uVar21];
  local_e0 = (ulong)block_size_high[uVar21];
  iVar20 = x->plane[0].src.stride;
  iVar14 = (x->e_mbd).plane[0].pre[0].stride;
  local_d0 = (ulong)""[uVar21];
  local_e8 = ref_mv;
  src = av1_get_scaled_ref_frame(cpi,(int)pMVar2->ref_frame[0]);
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar15 = (x->e_mbd).plane[0].pre;
    lVar18 = 0;
    do {
      puVar3 = pbVar15->buf;
      puVar22 = pbVar15->buf0;
      uVar5 = *(undefined8 *)&pbVar15->stride;
      *(undefined8 *)((long)local_b8 + lVar18 + 0x10) = *(undefined8 *)&pbVar15->width;
      *(undefined8 *)((long)local_b8 + lVar18 + 0x18) = uVar5;
      *(uint8_t **)((long)local_b8 + lVar18) = puVar3;
      *(uint8_t **)((long)local_b8 + lVar18 + 8) = puVar22;
      lVar18 = lVar18 + 0x20;
      pbVar15 = (buf_2d *)((long)(pbVar15 + 0x51) + 0x10);
    } while (lVar18 != 0x60);
    av1_setup_pre_planes(&x->e_mbd,0,src,mi_row,mi_col,(scale_factors *)0x0,3);
  }
  uVar8 = local_d8;
  uVar7 = local_e0;
  if ((x->e_mbd).bd == 8) {
    uVar9 = (uint)(aVar1 == AOM_CONTENT_SCREEN);
    iVar10 = (int)local_d0 + 1;
    iVar16 = ((uint)(local_d8 >> 5) & 0x7ffffff) + 3;
    local_c8 = (long)(me_search_size_col * 2) + local_d8;
    lVar18 = (long)(me_search_size_row * 2) + local_e0;
    ref = (int16_t *)aom_malloc(local_c8 * 2);
    local_c0 = lVar18;
    ref_00 = (int16_t *)aom_malloc(lVar18 * 2);
    memblk = (int16_t *)aom_malloc((ulong)(uint)((int)uVar8 * 2));
    src_00 = (int16_t *)aom_malloc((ulong)(uint)((int)uVar7 * 2));
    auVar24._0_4_ = -(uint)((int)((ulong)ref >> 0x20) == 0 && (int)ref == 0);
    auVar24._4_4_ = -(uint)((int)ref_00 == 0 && (int)((ulong)ref_00 >> 0x20) == 0);
    auVar24._8_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0 && (int)memblk == 0);
    auVar24._12_4_ = -(uint)((int)src_00 == 0 && (int)((ulong)src_00 >> 0x20) == 0);
    iVar11 = movmskps((int)src_00,auVar24);
    if (iVar11 != 0) {
      aom_free(ref);
      aom_free(ref_00);
      aom_free(memblk);
      aom_free(src_00);
      aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
    }
    iVar11 = (int)local_e0;
    local_f0 = memblk;
    (*aom_int_pro_row)(ref,(x->e_mbd).plane[0].pre[0].buf + -(long)me_search_size_col,iVar14,
                       (int)local_c8,iVar11,iVar10);
    iVar4 = (int)local_d8;
    (*aom_int_pro_col)(ref_00,(x->e_mbd).plane[0].pre[0].buf + -(long)(iVar14 * me_search_size_row),
                       iVar14,iVar4,(int)local_c0,iVar16);
    puVar3 = x->plane[0].src.buf;
    (*aom_int_pro_row)(memblk,puVar3,iVar20,iVar4,iVar11,iVar10);
    (*aom_int_pro_col)(src_00,puVar3,iVar20,iVar4,iVar11,iVar16);
    iVar10 = av1_vector_match(ref,local_f0,(uint)""[uVar21],me_search_size_col,uVar9,&local_10c);
    pMVar2->mv[0].as_mv.col = (int16_t)iVar10;
    iVar10 = av1_vector_match(ref_00,src_00,(int)local_d0,me_search_size_row,uVar9,&local_110);
    pMVar2->mv[0].as_mv.row = (int16_t)iVar10;
    if (aVar1 == AOM_CONTENT_SCREEN) {
      if (local_10c < local_110) {
        pMVar2->mv[0].as_mv.row = 0;
      }
      else {
        pMVar2->mv[0].as_mv.col = 0;
      }
    }
    MVar19 = pMVar2->mv[0].as_mv;
    uVar12 = (uint)MVar19 >> 0x10;
    puVar3 = x->plane[0].src.buf;
    puVar22 = (x->e_mbd).plane[0].pre[0].buf +
              (((int)MVar19 >> 0x10) + (int)MVar19.row * (x->e_mbd).plane[0].pre[0].stride);
    uVar9 = (*cpi->ppi->fn_ptr[uVar21].sdf)(puVar3,iVar20,puVar22,iVar14);
    if (pMVar2->mv[0].as_int == 0) {
      *y_sad_zero = uVar9;
    }
    else {
      uVar13 = (*cpi->ppi->fn_ptr[uVar21].sdf)
                         (x->plane[0].src.buf,iVar20,(x->e_mbd).plane[0].pre[0].buf,iVar14);
      *y_sad_zero = uVar13;
      if (uVar13 < uVar9) {
        pMVar2->mv[0].as_int = 0;
        puVar22 = (x->e_mbd).plane[0].pre[0].buf;
        MVar19.row = 0;
        MVar19.col = 0;
        uVar12 = 0;
        uVar9 = uVar13;
      }
    }
    if (!bVar23) {
      local_58 = (uint8_t *)((long)puVar22 - (long)iVar14);
      local_50 = puVar22 + -1;
      local_48 = puVar22 + 1;
      local_40 = puVar22 + iVar14;
      (*cpi->ppi->fn_ptr[uVar21].sdx4df)
                (puVar3,iVar20,(uint8_t **)(local_b8 + 0xc),iVar14,local_108);
      lVar18 = 0;
      do {
        uVar13 = local_108[lVar18];
        if (uVar13 < uVar9) {
          pMVar2->mv[0].as_mv.row =
               av1_int_pro_motion_estimation::search_pos[lVar18].row + MVar19.row;
          pMVar2->mv[0].as_mv.col =
               av1_int_pro_motion_estimation::search_pos[lVar18].col + (short)uVar12;
          uVar9 = uVar13;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 4);
      uVar13 = (int)MVar19 + (-(uint)(local_108[0] < local_108[3]) | 1);
      iVar10 = uVar12 + (-(uint)(local_108[1] < local_108[2]) | 1);
      uVar12 = (*cpi->ppi->fn_ptr[uVar21].sdf)
                         (puVar3,iVar20,
                          (x->e_mbd).plane[0].pre[0].buf +
                          ((int)(short)iVar10 +
                          (int)(short)uVar13 * (x->e_mbd).plane[0].pre[0].stride),iVar14);
      if (uVar12 < uVar9) {
        pMVar2->mv[0].as_int = uVar13 & 0xffff | iVar10 * 0x10000;
        uVar9 = uVar12;
      }
    }
    iVar20 = (x->mv_limits).col_min;
    iVar16 = local_e8->col + 7 >> 3;
    iVar11 = local_e8->row + 7 >> 3;
    iVar14 = (int)local_e8->col >> 3;
    iVar10 = (int)local_e8->row >> 3;
    if (iVar16 < -0x3ff) {
      iVar16 = -0x400;
    }
    if (iVar11 < -0x3ff) {
      iVar11 = -0x400;
    }
    if (0x3ff < iVar14) {
      iVar14 = 0x400;
    }
    if (0x3ff < iVar10) {
      iVar10 = 0x400;
    }
    iVar4 = iVar16 + -0x3ff;
    if (iVar16 + -0x3ff < iVar20) {
      iVar4 = iVar20;
    }
    iVar20 = (x->mv_limits).col_max;
    iVar16 = iVar14 + 0x3ff;
    if (iVar20 < iVar14 + 0x3ff) {
      iVar16 = iVar20;
    }
    uVar12 = (x->mv_limits).row_min;
    uVar13 = iVar11 - 0x3ffU;
    if ((int)(iVar11 - 0x3ffU) < (int)uVar12) {
      uVar13 = uVar12;
    }
    uVar12 = (x->mv_limits).row_max;
    uVar17 = iVar10 + 0x3ffU;
    if ((int)uVar12 < (int)(iVar10 + 0x3ffU)) {
      uVar17 = uVar12;
    }
    if (iVar16 < iVar4) {
      iVar16 = iVar4;
    }
    if ((int)uVar17 < (int)uVar13) {
      uVar17 = uVar13;
    }
    iVar20 = (int)pMVar2->mv[0].as_mv.col;
    if (iVar20 < iVar16) {
      iVar16 = iVar20;
    }
    if (iVar20 < iVar4) {
      iVar16 = iVar4;
    }
    uVar12 = (uint)pMVar2->mv[0].as_mv.row;
    if ((int)uVar12 < (int)uVar17) {
      uVar17 = uVar12;
    }
    if ((int)uVar12 < (int)uVar13) {
      uVar17 = uVar13;
    }
    pMVar2->mv[0].as_int = iVar16 * 0x80000 + (uVar17 & 0x1fff) * 8;
    if (src != (YV12_BUFFER_CONFIG *)0x0) {
      pbVar15 = (x->e_mbd).plane[0].pre;
      lVar18 = 0;
      do {
        puVar3 = *(uint8_t **)((long)local_b8 + lVar18);
        puVar22 = *(uint8_t **)((long)local_b8 + lVar18 + 8);
        uVar5 = *(undefined8 *)((long)local_b8 + lVar18 + 0x10);
        uVar6 = *(undefined8 *)((long)local_b8 + lVar18 + 0x18);
        pbVar15->width = (int)uVar5;
        pbVar15->height = (int)((ulong)uVar5 >> 0x20);
        *(undefined8 *)&pbVar15->stride = uVar6;
        pbVar15->buf = puVar3;
        pbVar15->buf0 = puVar22;
        lVar18 = lVar18 + 0x20;
        pbVar15 = (buf_2d *)((long)(pbVar15 + 0x51) + 0x10);
      } while (lVar18 != 0x60);
    }
    aom_free(ref);
    aom_free(ref_00);
    aom_free(local_f0);
    aom_free(src_00);
  }
  else {
    pMVar2->mv[0].as_int = 0;
    uVar9 = (*cpi->ppi->fn_ptr[uVar21].sdf)
                      (x->plane[0].src.buf,iVar20,(x->e_mbd).plane[0].pre[0].buf,iVar14);
    if (src != (YV12_BUFFER_CONFIG *)0x0) {
      pbVar15 = (x->e_mbd).plane[0].pre;
      lVar18 = 0;
      do {
        puVar3 = *(uint8_t **)((long)local_b8 + lVar18);
        puVar22 = *(uint8_t **)((long)local_b8 + lVar18 + 8);
        uVar5 = *(undefined8 *)((long)local_b8 + lVar18 + 0x10);
        uVar6 = *(undefined8 *)((long)local_b8 + lVar18 + 0x18);
        pbVar15->width = (int)uVar5;
        pbVar15->height = (int)((ulong)uVar5 >> 0x20);
        *(undefined8 *)&pbVar15->stride = uVar6;
        pbVar15->buf = puVar3;
        pbVar15->buf0 = puVar22;
        lVar18 = lVar18 + 0x20;
        pbVar15 = (buf_2d *)((long)(pbVar15 + 0x51) + 0x10);
      } while (lVar18 != 0x60);
    }
  }
  return uVar9;
}

Assistant:

unsigned int av1_int_pro_motion_estimation(const AV1_COMP *cpi, MACROBLOCK *x,
                                           BLOCK_SIZE bsize, int mi_row,
                                           int mi_col, const MV *ref_mv,
                                           unsigned int *y_sad_zero,
                                           int me_search_size_col,
                                           int me_search_size_row) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int idx;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int is_screen = cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  const int full_search = is_screen;
  const bool screen_scroll_superblock =
      is_screen && bsize == cm->seq_params->sb_size;
  // Keep border a multiple of 16.
  const int border = (cpi->oxcf.border_in_pixels >> 4) << 4;
  int search_size_width = me_search_size_col;
  int search_size_height = me_search_size_row;
  // Adjust based on boundary.
  if (((mi_col << 2) - search_size_width < -border) ||
      ((mi_col << 2) + search_size_width > cm->width + border))
    search_size_width = border;
  if (((mi_row << 2) - search_size_height < -border) ||
      ((mi_row << 2) + search_size_height > cm->height + border))
    search_size_height = border;
  const int src_stride = x->plane[0].src.stride;
  const int ref_stride = xd->plane[0].pre[0].stride;
  uint8_t const *ref_buf, *src_buf;
  int_mv *best_int_mv = &xd->mi[0]->mv[0];
  unsigned int best_sad, tmp_sad, this_sad[4];
  int best_sad_col, best_sad_row;
  const int row_norm_factor = mi_size_high_log2[bsize] + 1;
  const int col_norm_factor = 3 + (bw >> 5);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, mi->ref_frame[0]);
  static const MV search_pos[4] = {
    { -1, 0 },
    { 0, -1 },
    { 0, 1 },
    { 1, 0 },
  };

  if (scaled_ref_frame) {
    int i;
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // motion search code to be used without additional modifications.
    for (i = 0; i < MAX_MB_PLANE; i++) backup_yv12[i] = xd->plane[i].pre[0];
    av1_setup_pre_planes(xd, 0, scaled_ref_frame, mi_row, mi_col, NULL,
                         MAX_MB_PLANE);
  }

  if (xd->bd != 8) {
    best_int_mv->as_fullmv = kZeroFullMv;
    best_sad = cpi->ppi->fn_ptr[bsize].sdf(x->plane[0].src.buf, src_stride,
                                           xd->plane[0].pre[0].buf, ref_stride);

    if (scaled_ref_frame) {
      int i;
      for (i = 0; i < MAX_MB_PLANE; i++) xd->plane[i].pre[0] = backup_yv12[i];
    }
    return best_sad;
  }
  const int width_ref_buf = (search_size_width << 1) + bw;
  const int height_ref_buf = (search_size_height << 1) + bh;
  int16_t *hbuf = (int16_t *)aom_malloc(width_ref_buf * sizeof(*hbuf));
  int16_t *vbuf = (int16_t *)aom_malloc(height_ref_buf * sizeof(*vbuf));
  int16_t *src_hbuf = (int16_t *)aom_malloc(bw * sizeof(*src_hbuf));
  int16_t *src_vbuf = (int16_t *)aom_malloc(bh * sizeof(*src_vbuf));
  if (!hbuf || !vbuf || !src_hbuf || !src_vbuf) {
    aom_free(hbuf);
    aom_free(vbuf);
    aom_free(src_hbuf);
    aom_free(src_vbuf);
    aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }

  // Set up prediction 1-D reference set for rows.
  ref_buf = xd->plane[0].pre[0].buf - search_size_width;
  aom_int_pro_row(hbuf, ref_buf, ref_stride, width_ref_buf, bh,
                  row_norm_factor);

  // Set up prediction 1-D reference set for cols
  ref_buf = xd->plane[0].pre[0].buf - search_size_height * ref_stride;
  aom_int_pro_col(vbuf, ref_buf, ref_stride, bw, height_ref_buf,
                  col_norm_factor);

  // Set up src 1-D reference set
  src_buf = x->plane[0].src.buf;
  aom_int_pro_row(src_hbuf, src_buf, src_stride, bw, bh, row_norm_factor);
  aom_int_pro_col(src_vbuf, src_buf, src_stride, bw, bh, col_norm_factor);

  // Find the best match per 1-D search
  best_int_mv->as_fullmv.col =
      av1_vector_match(hbuf, src_hbuf, mi_size_wide_log2[bsize],
                       search_size_width, full_search, &best_sad_col);
  best_int_mv->as_fullmv.row =
      av1_vector_match(vbuf, src_vbuf, mi_size_high_log2[bsize],
                       search_size_height, full_search, &best_sad_row);

  // For screen: select between horiz or vert motion.
  if (is_screen) {
    if (best_sad_col < best_sad_row)
      best_int_mv->as_fullmv.row = 0;
    else
      best_int_mv->as_fullmv.col = 0;
  }

  FULLPEL_MV this_mv = best_int_mv->as_fullmv;
  src_buf = x->plane[0].src.buf;
  ref_buf = get_buf_from_fullmv(&xd->plane[0].pre[0], &this_mv);
  best_sad =
      cpi->ppi->fn_ptr[bsize].sdf(src_buf, src_stride, ref_buf, ref_stride);

  // Evaluate zero MV if found MV is non-zero.
  if (best_int_mv->as_int != 0) {
    tmp_sad = cpi->ppi->fn_ptr[bsize].sdf(x->plane[0].src.buf, src_stride,
                                          xd->plane[0].pre[0].buf, ref_stride);
    *y_sad_zero = tmp_sad;
    if (tmp_sad < best_sad) {
      best_int_mv->as_fullmv = kZeroFullMv;
      this_mv = best_int_mv->as_fullmv;
      ref_buf = xd->plane[0].pre[0].buf;
      best_sad = tmp_sad;
    }
  } else {
    *y_sad_zero = best_sad;
  }

  if (!screen_scroll_superblock) {
    const uint8_t *const pos[4] = {
      ref_buf - ref_stride,
      ref_buf - 1,
      ref_buf + 1,
      ref_buf + ref_stride,
    };

    cpi->ppi->fn_ptr[bsize].sdx4df(src_buf, src_stride, pos, ref_stride,
                                   this_sad);

    for (idx = 0; idx < 4; ++idx) {
      if (this_sad[idx] < best_sad) {
        best_sad = this_sad[idx];
        best_int_mv->as_fullmv.row = search_pos[idx].row + this_mv.row;
        best_int_mv->as_fullmv.col = search_pos[idx].col + this_mv.col;
      }
    }

    if (this_sad[0] < this_sad[3])
      this_mv.row -= 1;
    else
      this_mv.row += 1;

    if (this_sad[1] < this_sad[2])
      this_mv.col -= 1;
    else
      this_mv.col += 1;

    ref_buf = get_buf_from_fullmv(&xd->plane[0].pre[0], &this_mv);

    tmp_sad =
        cpi->ppi->fn_ptr[bsize].sdf(src_buf, src_stride, ref_buf, ref_stride);
    if (best_sad > tmp_sad) {
      best_int_mv->as_fullmv = this_mv;
      best_sad = tmp_sad;
    }
  }

  FullMvLimits mv_limits = x->mv_limits;
  av1_set_mv_search_range(&mv_limits, ref_mv);
  clamp_fullmv(&best_int_mv->as_fullmv, &mv_limits);

  convert_fullmv_to_mv(best_int_mv);

  if (scaled_ref_frame) {
    int i;
    for (i = 0; i < MAX_MB_PLANE; i++) xd->plane[i].pre[0] = backup_yv12[i];
  }

  aom_free(hbuf);
  aom_free(vbuf);
  aom_free(src_hbuf);
  aom_free(src_vbuf);
  return best_sad;
}